

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVGPainter.cpp
# Opt level: O0

void __thiscall
SVGChart::SVGPainter::DrawLine(SVGPainter *this,float inX1,float inY1,float inX2,float inY2)

{
  ostream *poVar1;
  float inY2_local;
  float inX2_local;
  float inY1_local;
  float inX1_local;
  SVGPainter *this_local;
  
  poVar1 = std::operator<<((ostream *)&this->field_0x38,"<line x1=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,inX1);
  poVar1 = std::operator<<(poVar1,"\" y1=\"");
  std::ostream::operator<<(poVar1,inY1);
  poVar1 = std::operator<<((ostream *)&this->field_0x38,"\" x2=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,inX2);
  poVar1 = std::operator<<(poVar1,"\" y2=\"");
  std::ostream::operator<<(poVar1,inY2);
  poVar1 = std::operator<<((ostream *)&this->field_0x38,"\" stroke=\"");
  poVar1 = std::operator<<(poVar1,"rgb(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->lineRed);
  std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&this->field_0x38,this->lineGreen);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->lineBlue);
  poVar1 = std::operator<<(poVar1,")");
  std::operator<<(poVar1,"\" />\n");
  return;
}

Assistant:

void SVGPainter::DrawLine (float inX1, float inY1, float inX2, float inY2) {
        svgContent << "<line x1=\"" << inX1 << "\" y1=\"" << inY1;
        svgContent << "\" x2=\"" << inX2 << "\" y2=\"" << inY2;
        svgContent << "\" stroke=\"" << "rgb(" << lineRed << ",";
        svgContent << lineGreen << "," << lineBlue << ")" << "\" />\n";
    }